

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rc4.cc
# Opt level: O0

void RC4_set_key(RC4_KEY *key,int len,uchar *data)

{
  uint uVar1;
  uint local_38;
  uint32_t tmp;
  uint i_1;
  uint id2;
  uint id1;
  uint i;
  uint32_t *d;
  uint8_t *key_local;
  uint len_local;
  RC4_KEY *rc4key_local;
  
  key->x = 0;
  key->y = 0;
  for (id2 = 0; id2 < 0x100; id2 = id2 + 1) {
    key->data[id2] = id2;
  }
  i_1 = 0;
  tmp = 0;
  for (local_38 = 0; local_38 < 0x100; local_38 = local_38 + 1) {
    uVar1 = key->data[local_38];
    tmp = data[i_1] + uVar1 + tmp & 0xff;
    i_1 = i_1 + 1;
    if (i_1 == len) {
      i_1 = 0;
    }
    key->data[local_38] = key->data[tmp];
    key->data[tmp] = uVar1;
  }
  return;
}

Assistant:

void RC4_set_key(RC4_KEY *rc4key, unsigned len, const uint8_t *key) {
  uint32_t *d = &rc4key->data[0];
  rc4key->x = 0;
  rc4key->y = 0;

  for (unsigned i = 0; i < 256; i++) {
    d[i] = i;
  }

  unsigned id1 = 0, id2 = 0;
  for (unsigned i = 0; i < 256; i++) {
    uint32_t tmp = d[i];
    id2 = (key[id1] + tmp + id2) & 0xff;
    if (++id1 == len) {
      id1 = 0;
    }
    d[i] = d[id2];
    d[id2] = tmp;
  }
}